

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_handle.c
# Opt level: O0

uint32_t skynet_handle_findname(char *name)

{
  handle_name *phVar1;
  handle_storage *lock;
  int iVar2;
  int iVar3;
  int c;
  handle_name *n;
  int mid;
  int end;
  int begin;
  uint32_t handle;
  handle_storage *s;
  char *name_local;
  
  lock = H;
  rwlock_rlock(&H->lock);
  end = 0;
  mid = 0;
  n._4_4_ = lock->name_count + -1;
  do {
    if (n._4_4_ < mid) {
LAB_0011719c:
      rwlock_runlock(&lock->lock);
      return end;
    }
    iVar2 = (mid + n._4_4_) / 2;
    phVar1 = lock->name;
    iVar3 = strcmp(phVar1[iVar2].name,name);
    if (iVar3 == 0) {
      end = phVar1[iVar2].handle;
      goto LAB_0011719c;
    }
    if (iVar3 < 0) {
      mid = iVar2 + 1;
    }
    else {
      n._4_4_ = iVar2 + -1;
    }
  } while( true );
}

Assistant:

uint32_t 
skynet_handle_findname(const char * name) {
	struct handle_storage *s = H;

	rwlock_rlock(&s->lock);

	uint32_t handle = 0;

	int begin = 0;
	int end = s->name_count - 1;
	while (begin<=end) {
		int mid = (begin+end)/2;
		struct handle_name *n = &s->name[mid];
		int c = strcmp(n->name, name);
		if (c==0) {
			handle = n->handle;
			break;
		}
		if (c<0) {
			begin = mid + 1;
		} else {
			end = mid - 1;
		}
	}

	rwlock_runlock(&s->lock);

	return handle;
}